

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O1

void unpackFile(string *cpioArchivePath,string *filename)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  char *__s;
  runtime_error *prVar5;
  ulong __n;
  DescriptorWrapper fd;
  string filenameFromArchive;
  header_old_cpio header;
  allocator<char> local_75;
  DescriptorWrapper local_74;
  string local_70;
  header_old_cpio local_4a;
  
  DescriptorWrapper::openFile(&local_74,cpioArchivePath,0);
  do {
    sVar3 = DescriptorWrapper::readTo(&local_74,&local_4a,0x1a);
    if (sVar3 == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unexpected EOF","");
      std::runtime_error::runtime_error(prVar5,(string *)&local_70);
      *(undefined ***)prVar5 = &PTR__runtime_error_00108d50;
      *(undefined4 *)(prVar5 + 0x10) = 0;
      __cxa_throw(prVar5,&CpioException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = isHeaderLittleEndian(&local_4a);
    if (bVar1) {
      switchEndianness(&local_4a);
    }
    sVar4 = getFilenameSizeFromBigEndianHeader(&local_4a);
    __n = ((uint)sVar4 & 1) + sVar4;
    __s = (char *)operator_new__(__n);
    memset(__s,0,__n);
    DescriptorWrapper::readTo(&local_74,__s,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_75);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar2 == 0) {
      iVar2 = 2;
    }
    else if (local_70._M_string_length == filename->_M_string_length) {
      if (local_70._M_string_length != 0) {
        iVar2 = bcmp(local_70._M_dataplus._M_p,(filename->_M_dataplus)._M_p,
                     local_70._M_string_length);
        if (iVar2 != 0) goto LAB_00103cff;
      }
      iVar2 = 1;
      unpackFileInternal(&local_4a,&local_74,&local_70);
    }
    else {
LAB_00103cff:
      sVar4 = getFileSizeFromBigEndianHeader(&local_4a);
      iVar2 = 0;
      DescriptorWrapper::seek(&local_74,((uint)sVar4 & 1) + sVar4,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    operator_delete__(__s);
    if (iVar2 != 0) {
      if (iVar2 != 2) {
        DescriptorWrapper::~DescriptorWrapper(&local_74);
        return;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Couldn\'t find specified file in archive","");
      std::runtime_error::runtime_error(prVar5,(string *)&local_70);
      *(undefined ***)prVar5 = &PTR__runtime_error_00108d50;
      *(undefined4 *)(prVar5 + 0x10) = 2;
      __cxa_throw(prVar5,&CpioException::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

void unpackFile(const string& cpioArchivePath, const string& filename) 
{
	ssize_t sz = -1;
	header_old_cpio header;


	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);

		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filenameFromArchive(cFilename.get());
		if (filenameFromArchive == "TRAILER!!!") {
			break;
		}
		else if (filenameFromArchive == filename) {
			unpackFileInternal(header, fd, filenameFromArchive);
			return;
		}

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	throw CpioException(CpioException::FileNotFoundInArchive, "Couldn't find specified file in archive");
	return;
}